

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void compile_dnref_search(compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks)

{
  ushort uVar1;
  int iVar2;
  sljit_compiler *compiler;
  long lVar3;
  sljit_u8 *psVar4;
  sljit_jump *psVar5;
  long *plVar6;
  sljit_label *psVar7;
  undefined8 *in_RCX;
  undefined8 *puVar8;
  long *plVar9;
  uint uVar10;
  ushort *puVar11;
  
  compiler = common->compiler;
  puVar11 = common->name_table + (ulong)((uint)cc & 0xffff) * common->name_entry_size;
  puVar8 = in_RCX;
  if (compiler->error == 0) {
    iVar2 = common->ovector_start;
    compiler->mode32 = 0;
    puVar8 = (undefined8 *)0x0;
    psVar4 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar2 + 8);
    if (psVar4 != (sljit_u8 *)0x0) {
      *psVar4 = 0x8b;
    }
  }
  if ((ushort)backtracks < 2) {
    plVar9 = (long *)0x0;
  }
  else {
    uVar10 = ((uint)backtracks & 0xffff) + 1;
    plVar9 = (long *)0x0;
    do {
      uVar1 = *puVar11;
      sljit_get_local_base
                (compiler,4,(long)common->ovector_start + (ulong)uVar1 * 0x10,(sljit_sw)puVar8);
      puVar8 = (undefined8 *)((long)common->ovector_start + (ulong)uVar1 * 0x10);
      psVar5 = sljit_emit_cmp(compiler,1,0x8e,(sljit_sw)puVar8,1,0);
      if ((compiler->error == 0) &&
         (plVar6 = (long *)ensure_abuf(compiler,0x10), plVar6 != (long *)0x0)) {
        plVar6[1] = (long)plVar9;
        *plVar6 = (long)psVar5;
        plVar9 = plVar6;
      }
      puVar11 = puVar11 + common->name_entry_size;
      uVar10 = uVar10 - 1;
    } while (2 < uVar10);
  }
  uVar1 = *puVar11;
  sljit_get_local_base
            (compiler,4,(long)common->ovector_start + (ulong)uVar1 * 0x10,(sljit_sw)puVar8);
  if ((((in_RCX != (undefined8 *)0x0) && (common->unset_backref == 0)) &&
      (psVar5 = sljit_emit_cmp(compiler,0,0x8e,(ulong)uVar1 * 0x10 + (long)common->ovector_start,1,0
                              ), compiler->error == 0)) &&
     (puVar8 = (undefined8 *)ensure_abuf(compiler,0x10), puVar8 != (undefined8 *)0x0)) {
    puVar8[1] = *in_RCX;
    *puVar8 = psVar5;
    *in_RCX = puVar8;
  }
  psVar7 = sljit_emit_label(compiler);
  for (; plVar9 != (long *)0x0; plVar9 = (long *)plVar9[1]) {
    if ((psVar7 != (sljit_label *)0x0) && (lVar3 = *plVar9, lVar3 != 0)) {
      *(ulong *)(lVar3 + 0x10) = (*(ulong *)(lVar3 + 0x10) & 0xfffffffffffffffc) + 1;
      *(sljit_label **)(lVar3 + 0x18) = psVar7;
    }
  }
  return;
}

Assistant:

static void compile_dnref_search(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks)
{
/* The OVECTOR offset goes to TMP2. */
DEFINE_COMPILER;
int count = GET2(cc, 1 + IMM2_SIZE);
PCRE2_SPTR slot = common->name_table + GET2(cc, 1) * common->name_entry_size;
unsigned int offset;
jump_list *found = NULL;

SLJIT_ASSERT(*cc == OP_DNREF || *cc == OP_DNREFI);

OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1));

count--;
while (count-- > 0)
  {
  offset = GET2(slot, 0) << 1;
  GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
  add_jump(compiler, &found, CMP(SLJIT_NOT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));
  slot += common->name_entry_size;
  }

offset = GET2(slot, 0) << 1;
GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
if (backtracks != NULL && !common->unset_backref)
  add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));

set_jumps(found, LABEL());
}